

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SelectDefaultSearchModes(cmFindCommon *this)

{
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  bool bVar2;
  char *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  long lVar3;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_5UL>
  search_paths;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_5UL>
  local_e8;
  
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            (local_e8._M_elems,&this->NoPackageRootPath,
             (char (*) [33])"CMAKE_FIND_USE_PACAKGE_ROOT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[26],_true>
            (local_e8._M_elems + 1,&this->NoCMakePath,(char (*) [26])"CMAKE_FIND_USE_CMAKE_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[38],_true>
            (local_e8._M_elems + 2,&this->NoCMakeEnvironmentPath,
             (char (*) [38])"CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[39],_true>
            (local_e8._M_elems + 3,&this->NoSystemEnvironmentPath,
             (char (*) [39])"CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            (local_e8._M_elems + 4,&this->NoCMakeSystemPath,
             (char (*) [33])"CMAKE_FIND_USE_CMAKE_SYSTEM_PATH");
  ppVar1 = local_e8._M_elems;
  for (lVar3 = 200; name = &ppVar1->second, lVar3 != 0; lVar3 = lVar3 + -0x28) {
    val = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    if (val != (char *)0x0) {
      bVar2 = cmSystemTools::IsOn(val);
      *(bool *)*(undefined8 *)((long)(name + -1) + 0x18) = !bVar2;
    }
    ppVar1 = (pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(name + 1);
  }
  std::
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_5UL>
  ::~array(&local_e8);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultSearchModes()
{
  const std::array<std::pair<bool&, std::string>, 5> search_paths = {
    { { this->NoPackageRootPath, "CMAKE_FIND_USE_PACAKGE_ROOT_PATH" },
      { this->NoCMakePath, "CMAKE_FIND_USE_CMAKE_PATH" },
      { this->NoCMakeEnvironmentPath,
        "CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH" },
      { this->NoSystemEnvironmentPath,
        "CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH" },
      { this->NoCMakeSystemPath, "CMAKE_FIND_USE_CMAKE_SYSTEM_PATH" } }
  };

  for (auto& path : search_paths) {
    const char* def = this->Makefile->GetDefinition(path.second);
    if (def) {
      path.first = !cmSystemTools::IsOn(def);
    }
  }
}